

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O3

void __thiscall
TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_Test::testBody
          (TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_Test *this)

{
  int iVar1;
  MockCheckedExpectedCall *pMVar2;
  UtestShell *test;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MockExpectedParameterDidntHappenFailure expectedFailure;
  MockFailureReporterInstaller local_b1;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  MockExpectedCallsList local_80;
  TestFailure local_70;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_b1);
  MockExpectedCallsList::MockExpectedCallsList(&local_80);
  local_80._vptr_MockExpectedCallsList = (_func_int **)&PTR__MockExpectedCallsListForTest_002aa030;
  SimpleString::SimpleString((SimpleString *)&local_70,"foo");
  pMVar2 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)&local_80,(SimpleString *)&local_70);
  SimpleString::SimpleString(&local_b0,"p1");
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0xb])(pMVar2,&local_b0,1);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_b0,"foo");
  MockExpectedParameterDidntHappenFailure::MockExpectedParameterDidntHappenFailure
            ((MockExpectedParameterDidntHappenFailure *)&local_70,test,&local_b0,&local_80,&local_80
            );
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar3 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_a0);
  SimpleString::SimpleString(&local_90,"p1");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
            ((long *)CONCAT44(extraout_var,iVar1),&local_90,1);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar3 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"foo");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_a0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar3 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_a0);
  SimpleString::SimpleString(&local_90,"p1");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x40))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_90,1);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x26e);
  TestFailure::~TestFailure(&local_70);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_80);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_b1);
  return;
}

Assistant:

TEST(MockParameterTest, newCallStartsWhileNotAllParametersWerePassed)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("p1", 1);
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().expectOneCall("foo").withParameter("p1", 1);
    mock().actualCall("foo");
    mock().actualCall("foo").withParameter("p1", 1);

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}